

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilNam.c
# Opt level: O2

Vec_Int_t * Abc_NamComputeIdMap(Abc_Nam_t *p1,Abc_Nam_t *p2)

{
  uint nCap;
  int *__s;
  int iVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  Vec_Int_t *p;
  
  nCap = (p1->vInt2Handle).nSize;
  pVVar2 = Vec_IntAlloc(nCap);
  pVVar2->nSize = nCap;
  if (p1 == p2) {
    uVar4 = 0;
    uVar6 = (ulong)nCap;
    if ((int)nCap < 1) {
      uVar6 = uVar4;
    }
    for (; uVar6 != uVar4; uVar4 = uVar4 + 1) {
      pVVar2->pArray[uVar4] = (int)uVar4;
    }
  }
  else {
    __s = pVVar2->pArray;
    memset(__s,0,(long)(int)nCap * 4);
    for (lVar5 = 1; lVar5 < (p1->vInt2Handle).nSize; lVar5 = lVar5 + 1) {
      iVar1 = Vec_IntEntry(&p1->vInt2Handle,(int)lVar5);
      piVar3 = Abc_NamStrHashFind(p2,p1->pStore + iVar1,(char *)0x0);
      if ((int)nCap <= lVar5) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      __s[lVar5] = *piVar3;
    }
  }
  return pVVar2;
}

Assistant:

Vec_Int_t * Abc_NamComputeIdMap( Abc_Nam_t * p1, Abc_Nam_t * p2 )
{
    Vec_Int_t * vMap;
    char * pThis;
    int * piPlace, iHandle1, i;
    if ( p1 == p2 )
        return Vec_IntStartNatural( Abc_NamObjNumMax(p1) );
    vMap = Vec_IntStart( Abc_NamObjNumMax(p1) );
    Vec_IntForEachEntryStart( &p1->vInt2Handle, iHandle1, i, 1 )
    {
        pThis = Abc_NamHandleToStr( p1, iHandle1 );
        piPlace = Abc_NamStrHashFind( p2, pThis, NULL );
        Vec_IntWriteEntry( vMap, i, *piPlace );
//        Abc_Print( 1, "%d->%d  ", i, *piPlace );
    }
    return vMap;
}